

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

void CVmObjBigNum::calc_asincos_into(char *dst,char *src,int is_acos)

{
  uint uVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  int in_EDX;
  int sqrt_neg;
  int use_sqrt;
  char *tmp;
  err_frame_t err_cur__;
  char *pi;
  char *ext5;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  size_t prec;
  char *pcVar5;
  char *src_00;
  char *dst_00;
  char *pcVar6;
  char *in_stack_fffffffffffffe68;
  unsigned_long *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *ext1_00;
  char *in_stack_fffffffffffffe80;
  int local_170;
  undefined4 in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffeb0;
  char local_70 [8];
  char *local_68;
  char *local_60;
  char *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint local_40;
  uint local_3c;
  size_t local_38;
  int local_2c;
  
  local_2c = in_EDX;
  local_38 = get_prec((char *)0x30d950);
  cache_pi(CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pcVar5 = &stack0xffffffffffffffbc;
  src_00 = local_70;
  dst_00 = &stack0xffffffffffffffb8;
  pcVar6 = &stack0xffffffffffffffb4;
  alloc_temp_regs(local_38 + 3,5,&local_58,&local_3c,&local_60,&local_40,&local_68);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  ext1_00 = (char *)*puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)&stack0xfffffffffffffea0;
  uVar1 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffeb8);
  if (uVar1 == 0) {
    copy_val(dst_00,src_00,(int)((ulong)pcVar5 >> 0x20));
    get_one();
    copy_val(dst_00,src_00,(int)((ulong)pcVar5 >> 0x20));
    iVar2 = compare_abs(local_60,in_stack_fffffffffffffe80);
    if (0 < iVar2) {
      err_throw(0);
    }
    copy_val(dst_00,src_00,(int)((ulong)pcVar5 >> 0x20));
    iVar2 = compare_abs(local_60,in_stack_fffffffffffffe80);
    if (0 < iVar2) {
      local_170 = get_neg(local_58);
      compute_prod_into(in_stack_fffffffffffffeb0,ext1_00,
                        (char *)CONCAT44(in_stack_fffffffffffffea4,uVar1));
      in_stack_fffffffffffffe80 = local_68;
      get_one();
      copy_val(dst_00,src_00,(int)((ulong)pcVar5 >> 0x20));
      make_negative((char *)0x30db2a);
      compute_sum_into(dst_00,src_00,pcVar5);
      compute_sqrt_into((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    local_58 = calc_asin_series(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                (char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,pcVar6);
    if (0 < iVar2) {
      copy_val(dst_00,src_00,(int)((ulong)pcVar5 >> 0x20));
      div_by_long(in_stack_fffffffffffffe80,(unsigned_long)in_stack_fffffffffffffe78,
                  in_stack_fffffffffffffe70);
      negate(pcVar5);
      compute_sum_into(dst_00,src_00,pcVar5);
      if (local_170 != 0) {
        negate(pcVar5);
      }
      pcVar6 = local_58;
      local_58 = local_68;
      local_68 = pcVar6;
    }
    if (local_2c != 0) {
      copy_val(dst_00,src_00,(int)((ulong)pcVar5 >> 0x20));
      div_by_long(in_stack_fffffffffffffe80,(unsigned_long)in_stack_fffffffffffffe78,
                  in_stack_fffffffffffffe70);
      negate(pcVar5);
      compute_sum_into(dst_00,src_00,pcVar5);
      pcVar6 = local_68;
      local_68 = local_58;
      local_58 = pcVar6;
    }
    copy_val(dst_00,src_00,(int)((ulong)pcVar5 >> 0x20));
  }
  if ((uVar1 & 0x8000) == 0) {
    release_temp_regs(5,(ulong)local_3c,(ulong)local_40,(ulong)in_stack_ffffffffffffffbc,
                      (ulong)in_stack_ffffffffffffffb8,(ulong)in_stack_ffffffffffffffb4);
  }
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = ext1_00;
  if ((uVar1 & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    pcVar5 = in_stack_fffffffffffffeb0;
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
      pcVar5 = in_stack_fffffffffffffeb0;
    }
    in_stack_fffffffffffffeb0 = pcVar5;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(char **)(*plVar4 + 0x10) = pcVar5;
    err_rethrow();
  }
  if ((uVar1 & 2) != 0) {
    free(in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

void CVmObjBigNum::calc_asincos_into(char *dst, const char *src,
                                     int is_acos)
{
    size_t prec = get_prec(dst);
    uint hdl1, hdl2, hdl3, hdl4, hdl5;
    char *ext1, *ext2, *ext3, *ext4, *ext5;
    const char *pi;

    /* cache pi to our working precision */
    pi = cache_pi(prec + 3);

    /* 
     *   allocate our temporary registers - use some extra precision over
     *   what we need for the result, to reduce the effect of accumulated
     *   rounding error 
     */
    alloc_temp_regs(prec + 3, 5,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5);

    /* catch errors so we release our temp registers */
    err_try
    {
        char *tmp;
        static const unsigned char one_over_sqrt2[] =
        {
            /* precision = 10, scale = 0, flags = 0 */
            10, 0, 0, 0, 0,
            0x70, 0x71, 0x06, 0x78, 0x14
        };
        int use_sqrt;
        int sqrt_neg;
        
        /* get the initial value of x into our accumulator, r1 */
        copy_val(ext1, src, FALSE);

        /* 
         *   check to see if the absolute value of the argument is greater
         *   than 1 - if it is, it's not valid 
         */
        copy_val(ext2, get_one(), FALSE);
        if (compare_abs(ext1, ext2) > 0)
            err_throw(VMERR_OUT_OF_RANGE);

        /* presume we won't need to use the sqrt(1-x^2) method */
        use_sqrt = FALSE;

        /*
         *   Check to see if the absolute value of the argument is greater
         *   than 1/sqrt(2).  If it is, the series expansion converges too
         *   slowly (as slowly as never, if the value is exactly 1).  To
         *   speed things up, in these cases calculate pi/2 -
         *   asin(sqrt(1-x^2)) instead, which is equivalent but gives us a
         *   smaller asin() argument for quicker series convergence.
         *   
         *   We don't need to compare to 1/sqrt(2) in great precision;
         *   just use a few digits.  
         */
        copy_val(ext2, (const char *)one_over_sqrt2, TRUE);
        if (compare_abs(ext1, ext2) > 0)
        {
            /* flag that we're using the sqrt method */
            use_sqrt = TRUE;
            
            /* note the sign - we'll need to apply this to the result */
            sqrt_neg = get_neg(ext1);

            /* compute x^2 into r2 */
            compute_prod_into(ext2, ext1, ext1);

            /* subtract r2 from 1 (by adding -r2 to 1), storing in r4 */
            copy_val(ext3, get_one(), FALSE);
            make_negative(ext2);
            compute_sum_into(ext4, ext3, ext2);

            /* compute sqrt(1-x^2) (which is sqrt(r4)) into r1 */
            compute_sqrt_into(ext1, ext4);
        }

        /* compute the arcsine */
        ext1 = calc_asin_series(ext1, ext2, ext3, ext4, ext5);

        /* if we're using the sqrt method, finish the sqrt calculation */
        if (use_sqrt)
        {
            /* calculate pi/2 */
            copy_val(ext2, pi, TRUE);
            div_by_long(ext2, 2);

            /* compute pi/2 - r1 by negating r1 and adding it */
            negate(ext1);
            compute_sum_into(ext3, ext2, ext1);

            /* negate the result if the original value was negative */
            if (sqrt_neg)
                negate(ext3);

            /* swap the result back into r1 */
            tmp = ext1;
            ext1 = ext3;
            ext3 = tmp;
        }

        /* 
         *   We now have the arcsine in r1.  If we actually wanted the
         *   arccosine, subtract the arcsine from pi/2 to yield the
         *   arccosine.  
         */
        if (is_acos)
        {
            /* get pi/2 into r2 */
            copy_val(ext2, pi, TRUE);
            div_by_long(ext2, 2);
            
            /* negate r1 to get -asin */
            negate(ext1);
            
            /* add -asin to r2 to yield the arccosine in r3 */
            compute_sum_into(ext3, ext2, ext1);
            
            /* swap the result back into ext1 */
            tmp = ext3;
            ext3 = ext1;
            ext1 = tmp;
        }

        /* store the result, rounding if necessary */
        copy_val(dst, ext1, TRUE);
    }